

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O0

bool TasOptimization::testGradientDescentState(bool verbose)

{
  ulong uVar1;
  bool bVar2;
  pointer pdVar3;
  pointer pdVar4;
  size_type sVar5;
  reference pvVar6;
  double *pdVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  pointer pdVar9;
  double dVar10;
  int local_14c;
  double *local_148;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_140;
  ulong local_138;
  size_t i_4;
  double *local_128;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_120;
  ulong local_118;
  size_t i_3;
  value_type_conflict1 local_108;
  undefined1 local_100 [8];
  vector<double,_std::allocator<double>_> new_x;
  size_t i_2;
  double *local_d8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_d0;
  ulong local_c8;
  size_t i_1;
  double *local_b8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_b0;
  ulong local_a8;
  size_t i;
  vector<double,_std::allocator<double>_> compare_x;
  undefined1 local_70 [8];
  GradientDescentState state;
  allocator<double> local_39;
  value_type_conflict1 local_38;
  undefined1 local_30 [8];
  vector<double,_std::allocator<double>_> dummy_x;
  size_t num_dimensions;
  test_result test;
  bool verbose_local;
  
  num_dimensions._7_1_ = verbose;
  test_result::test_result((test_result *)((long)&num_dimensions + 5));
  dummy_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x5;
  local_38 = 1.0;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_30,5,&local_38,&local_39);
  std::allocator<double>::~allocator(&local_39);
  GradientDescentState::GradientDescentState
            ((GradientDescentState *)local_70,(vector<double,_std::allocator<double>_> *)local_30,
             0.1);
  pdVar4 = dummy_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pdVar3 = (pointer)GradientDescentState::getNumDimensions((GradientDescentState *)local_70);
  test_result::tassert((test_result *)((long)&num_dimensions + 5),pdVar4 == pdVar3);
  dVar10 = GradientDescentState::getAdaptiveStepsize((GradientDescentState *)local_70);
  test_result::tassert((test_result *)((long)&num_dimensions + 5),(bool)(-(dVar10 == 0.1) & 1));
  GradientDescentState::getX
            ((vector<double,_std::allocator<double>_> *)
             &compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(GradientDescentState *)local_70);
  pdVar4 = (pointer)std::vector<double,_std::allocator<double>_>::size
                              ((vector<double,_std::allocator<double>_> *)
                               &compare_x.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
  test_result::tassert
            ((test_result *)((long)&num_dimensions + 5),
             pdVar4 == dummy_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &compare_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  GradientDescentState::getX
            ((vector<double,_std::allocator<double>_> *)&i,(GradientDescentState *)local_70);
  local_a8 = 0;
  while( true ) {
    uVar1 = local_a8;
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)&i);
    if (sVar5 <= uVar1) break;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i,local_a8);
    dVar10 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_30,local_a8);
    test_result::tassert
              ((test_result *)((long)&num_dimensions + 5),(bool)(-(dVar10 == *pvVar6) & 1));
    local_a8 = local_a8 + 1;
  }
  local_b0._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)&i);
  local_b8 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)&i);
  i_1._4_4_ = 0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            (local_b0,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      local_b8,(int *)((long)&i_1 + 4));
  pdVar7 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)&i);
  GradientDescentState::getX((GradientDescentState *)local_70,pdVar7);
  local_c8 = 0;
  while( true ) {
    uVar1 = local_c8;
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)&i);
    if (sVar5 <= uVar1) break;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i,local_c8);
    dVar10 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_30,local_c8);
    test_result::tassert
              ((test_result *)((long)&num_dimensions + 5),(bool)(-(dVar10 == *pvVar6) & 1));
    local_c8 = local_c8 + 1;
  }
  local_d0._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)&i);
  local_d8 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)&i);
  i_2._4_4_ = 0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            (local_d0,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      local_d8,(int *)((long)&i_2 + 4));
  pvVar8 = GradientDescentState::operator_cast_to_vector_((GradientDescentState *)local_70);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&i,pvVar8);
  new_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  while( true ) {
    pdVar4 = new_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pdVar9 = (pointer)std::vector<double,_std::allocator<double>_>::size
                                ((vector<double,_std::allocator<double>_> *)&i);
    pdVar3 = dummy_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (pdVar9 <= pdVar4) break;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i,
                        (size_type)
                        new_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    dVar10 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_30,
                        (size_type)
                        new_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    test_result::tassert
              ((test_result *)((long)&num_dimensions + 5),(bool)(-(dVar10 == *pvVar6) & 1));
    new_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((long)new_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 1);
  }
  local_108 = 2.0;
  std::allocator<double>::allocator((allocator<double> *)((long)&i_3 + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_100,(size_type)pdVar3,&local_108,
             (allocator<double> *)((long)&i_3 + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&i_3 + 7));
  GradientDescentState::setX
            ((GradientDescentState *)local_70,(vector<double,_std::allocator<double>_> *)local_100);
  pvVar8 = GradientDescentState::operator_cast_to_vector_((GradientDescentState *)local_70);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&i,pvVar8);
  local_118 = 0;
  while( true ) {
    uVar1 = local_118;
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)&i);
    if (sVar5 <= uVar1) break;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_100,local_118);
    dVar10 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i,local_118);
    test_result::tassert
              ((test_result *)((long)&num_dimensions + 5),(bool)(-(dVar10 == *pvVar6) & 1));
    local_118 = local_118 + 1;
  }
  local_120._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)&i);
  local_128 = (double *)
              std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)&i);
  i_4._4_4_ = 0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            (local_120,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)local_128,
             (int *)((long)&i_4 + 4));
  pdVar7 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)local_100);
  GradientDescentState::setX((GradientDescentState *)local_70,pdVar7);
  pvVar8 = GradientDescentState::operator_cast_to_vector_((GradientDescentState *)local_70);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&i,pvVar8);
  local_138 = 0;
  while( true ) {
    uVar1 = local_138;
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)&i);
    if (sVar5 <= uVar1) break;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_100,local_138);
    dVar10 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i,local_138);
    test_result::tassert
              ((test_result *)((long)&num_dimensions + 5),(bool)(-(dVar10 == *pvVar6) & 1));
    local_138 = local_138 + 1;
  }
  local_140._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)&i);
  local_148 = (double *)
              std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)&i);
  local_14c = 0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            (local_140,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)local_148,
             &local_14c);
  GradientDescentState::setAdaptiveStepsize((GradientDescentState *)local_70,0.2);
  dVar10 = GradientDescentState::getAdaptiveStepsize((GradientDescentState *)local_70);
  test_result::tassert((test_result *)((long)&num_dimensions + 5),(bool)(-(dVar10 == 0.2) & 1));
  bVar2 = test_result::failed_any((test_result *)((long)&num_dimensions + 5));
  if ((bVar2) || ((num_dimensions._7_1_ & 1) != 0)) {
    bVar2 = test_result::success((test_result *)((long)&num_dimensions + 5));
    reportPassFail(bVar2,"Gradient Descent","State Unit Tests");
  }
  bVar2 = test_result::success((test_result *)((long)&num_dimensions + 5));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_100);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&i);
  GradientDescentState::~GradientDescentState((GradientDescentState *)local_70);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  return bVar2;
}

Assistant:

bool testGradientDescentState(bool verbose) {
    test_result test;

    // Check contructor.
    size_t num_dimensions = 5;
    std::vector<double> dummy_x(num_dimensions, 1);
    GradientDescentState state = GradientDescentState(dummy_x, 0.1);
    test.tassert(num_dimensions == state.getNumDimensions());
    test.tassert(state.getAdaptiveStepsize() == 0.1);
    test.tassert(state.getX().size() == num_dimensions);

    // Check getters and coverters.
    std::vector<double> compare_x = state.getX();
    for (size_t i=0; i<compare_x.size(); i++) test.tassert(compare_x[i] == dummy_x[i]);
    std::fill(compare_x.begin(), compare_x.end(), 0);
    state.getX(compare_x.data());
    for (size_t i=0; i<compare_x.size(); i++) test.tassert(compare_x[i] == dummy_x[i]);
    std::fill(compare_x.begin(), compare_x.end(), 0);
    compare_x = state;
    for (size_t i=0; i<compare_x.size(); i++) test.tassert(compare_x[i] == dummy_x[i]);

    // Check setters.
    std::vector<double> new_x(num_dimensions, 2);
    state.setX(new_x);
    compare_x = state;
    for (size_t i=0; i<compare_x.size(); i++) test.tassert(new_x[i] == compare_x[i]);
    std::fill(compare_x.begin(), compare_x.end(), 0);
    state.setX(new_x.data());
    compare_x = state;
    for (size_t i=0; i<compare_x.size(); i++) test.tassert(new_x[i] == compare_x[i]);
    std::fill(compare_x.begin(), compare_x.end(), 0);
    state.setAdaptiveStepsize(0.2);
    test.tassert(state.getAdaptiveStepsize() == 0.2);

    // Reporting.
    if (test.failed_any() or verbose) reportPassFail(test.success(), "Gradient Descent", "State Unit Tests");
    return test.success();
}